

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall rengine::RectangleNode::setColor(RectangleNode *this,vec4 color)

{
  bool bVar1;
  float *pfVar2;
  undefined8 uVar3;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  undefined1 auStack_38 [8];
  vec4 c;
  RectangleNode *this_local;
  vec4 color_local;
  
  uVar3 = color._8_8_;
  local_3c = 1.0;
  auStack_38 = (undefined1  [8])color._0_8_;
  c._0_8_ = uVar3;
  pfVar2 = std::min<float>((float *)auStack_38,&local_3c);
  local_40 = 0.0;
  pfVar2 = std::max<float>(pfVar2,&local_40);
  auStack_38._0_4_ = *pfVar2;
  local_44 = 1.0;
  pfVar2 = std::min<float>((float *)(auStack_38 + 4),&local_44);
  local_48 = 0.0;
  pfVar2 = std::max<float>(pfVar2,&local_48);
  auStack_38._4_4_ = *pfVar2;
  local_4c = 1.0;
  pfVar2 = std::min<float>(&c.x,&local_4c);
  local_50 = 0.0;
  pfVar2 = std::max<float>(pfVar2,&local_50);
  c.x = *pfVar2;
  local_54 = 1.0;
  pfVar2 = std::min<float>(&c.y,&local_54);
  local_58 = 0.0;
  pfVar2 = std::max<float>(pfVar2,&local_58);
  c.y = *pfVar2;
  bVar1 = vec4::operator==((vec4 *)auStack_38,*(vec4 *)&(this->super_RectangleNodeBase).field_0x44);
  if (!bVar1) {
    *(long *)&(this->super_RectangleNodeBase).field_0x44 = color._0_8_;
    *(float *)&this->field_0x4c = (float)uVar3;
    *(float *)&this->field_0x50 = SUB84(uVar3,4);
    Signal<>::emit(&onColorChanged,(SignalEmitter *)this);
  }
  return;
}

Assistant:

void setColor(vec4 color) {
        vec4 c = color;
        c.x = std::max(std::min(c.x, 1.0f), 0.0f);
        c.y = std::max(std::min(c.y, 1.0f), 0.0f);
        c.z = std::max(std::min(c.z, 1.0f), 0.0f);
        c.w = std::max(std::min(c.w, 1.0f), 0.0f);
        if (c == m_color)
            return;
        m_color = color;
        onColorChanged.emit(this);
    }